

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

void start_output_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_d_coef_controller *pjVar2;
  JQUANT_TBL *pJVar3;
  int (*paiVar4) [64];
  bool bVar5;
  _func_void_j_decompress_ptr *p_Var6;
  code *pcVar7;
  jpeg_component_info *pjVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  my_coef_ptr coef;
  
  pjVar2 = cinfo->coef;
  if (pjVar2->coef_arrays == (jvirt_barray_ptr *)0x0) goto LAB_0023c669;
  if (((cinfo->do_block_smoothing == 0) || (cinfo->progressive_mode == 0)) ||
     (cinfo->coef_bits == (int (*) [64])0x0)) {
LAB_0023c65e:
    pcVar7 = decompress_data;
  }
  else {
    p_Var6 = pjVar2[5].start_output_pass;
    if (p_Var6 == (_func_void_j_decompress_ptr *)0x0) {
      p_Var6 = (_func_void_j_decompress_ptr *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x18);
      pjVar2[5].start_output_pass = p_Var6;
    }
    pjVar8 = cinfo->comp_info;
    lVar9 = 0;
    bVar5 = false;
    for (lVar10 = 0; lVar10 < cinfo->num_components; lVar10 = lVar10 + 1) {
      pJVar3 = pjVar8->quant_table;
      if (((((pJVar3 == (JQUANT_TBL *)0x0) || (pJVar3->quantval[0] == 0)) ||
           ((pJVar3->quantval[1] == 0 ||
            ((pJVar3->quantval[8] == 0 || (pJVar3->quantval[0x10] == 0)))))) ||
          (pJVar3->quantval[9] == 0)) ||
         ((pJVar3->quantval[2] == 0 ||
          (paiVar4 = cinfo->coef_bits, lVar11 = 1, paiVar4[lVar10][0] < 0)))) goto LAB_0023c65e;
      for (; lVar11 != 6; lVar11 = lVar11 + 1) {
        iVar1 = *(int *)((long)*paiVar4 + lVar11 * 4 + lVar9);
        *(int *)(p_Var6 + lVar11 * 4) = iVar1;
        if (iVar1 != 0) {
          bVar5 = true;
        }
      }
      p_Var6 = p_Var6 + 0x18;
      pjVar8 = pjVar8 + 1;
      lVar9 = lVar9 + 0x100;
    }
    if (!bVar5) goto LAB_0023c65e;
    pcVar7 = decompress_smooth_data;
  }
  pjVar2->decompress_data = pcVar7;
LAB_0023c669:
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass (j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}